

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

bool LTAptDump(string *_aptId)

{
  pointer pRVar1;
  pointer pSVar2;
  pointer pTVar3;
  size_t sVar4;
  bool bVar5;
  size_type sVar6;
  mapped_type *this;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  pointer pSVar10;
  size_t sVar11;
  char *pcVar12;
  pointer pTVar13;
  TaxiNode *n;
  pointer pRVar14;
  pointer pTVar15;
  pointer pTVar16;
  string fileName;
  ofstream out;
  undefined8 auStack_228 [63];
  
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
          ::count(&gmapApt_abi_cxx11_,_aptId);
  if (sVar6 == 0) {
    bVar5 = false;
  }
  else {
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
           ::at(&gmapApt_abi_cxx11_,_aptId);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                   &dataRefs.XPSystemPath,_aptId);
    std::operator+(&fileName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,".csv")
    ;
    std::__cxx11::string::~string((string *)&out);
    std::ofstream::ofstream(&out,(string *)&fileName,_S_trunc|_S_out);
    std::operator<<((ostream *)&out,
                    "type,BOT,symbol,color,rotation,latitude,longitude,time,speed,course,name,desc\n"
                   );
    *(undefined8 *)((long)auStack_228 + *(long *)(_out + -0x18)) = 0xb;
    pRVar1 = (this->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar14 = (this->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>.
                   _M_impl.super__Vector_impl_data._M_start; pRVar14 != pRVar1;
        pRVar14 = pRVar14 + 1) {
      poVar7 = std::operator<<((ostream *)&out,"W,,");
      poVar7 = std::operator<<(poVar7,"arrow,");
      poVar7 = std::operator<<(poVar7,"red,");
      lround(pRVar14->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>((pRVar14->super_TaxiNode).lat);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>((pRVar14->super_TaxiNode).lon);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,",,,");
      poVar7 = std::operator<<(poVar7,(string *)&pRVar14->id);
      poVar7 = std::operator<<(poVar7,',');
      lround(pRVar14->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,anon_var_dwarf_13864b);
      std::operator<<(poVar7,"\n");
    }
    pSVar2 = (this->vecStartupLocs).super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pSVar10 = (this->vecStartupLocs).
                   super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>._M_impl.
                   super__Vector_impl_data._M_start; pSVar10 != pSVar2; pSVar10 = pSVar10 + 1) {
      poVar7 = std::operator<<((ostream *)&out,"W,,");
      poVar7 = std::operator<<(poVar7,"wedge,");
      poVar7 = std::operator<<(poVar7,"orange,");
      lround(pSVar10->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>((pSVar10->super_TaxiNode).lat);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>((pSVar10->super_TaxiNode).lon);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,",,,");
      poVar7 = std::operator<<(poVar7,(string *)&pSVar10->id);
      poVar7 = std::operator<<(poVar7,',');
      lround(pSVar10->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,anon_var_dwarf_13864b);
      std::operator<<(poVar7,"\n");
    }
    pSVar2 = (this->vecStartupLocs).super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pSVar10 = (this->vecStartupLocs).
                   super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>._M_impl.
                   super__Vector_impl_data._M_start; pSVar10 != pSVar2; pSVar10 = pSVar10 + 1) {
      poVar7 = std::operator<<((ostream *)&out,"T,1,,");
      poVar7 = std::operator<<(poVar7,"orange,");
      lround(pSVar10->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>((pSVar10->super_TaxiNode).lat);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>((pSVar10->super_TaxiNode).lon);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,",,");
      lround(pSVar10->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,"Path leaving ");
      poVar7 = std::operator<<(poVar7,(string *)&pSVar10->id);
      poVar7 = std::operator<<(poVar7,',');
      lround(pSVar10->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,anon_var_dwarf_13864b);
      std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<((ostream *)&out,"T,0,,");
      poVar7 = std::operator<<(poVar7,"orange,");
      lround(pSVar10->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>((pSVar10->viaPos).y);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>((pSVar10->viaPos).x);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,",,");
      lround(pSVar10->heading);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,',');
      std::operator<<(poVar7,"\n");
    }
    pTVar16 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
              super__Vector_impl_data._M_finish;
    sVar11 = 0;
    for (pTVar15 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                   _M_impl.super__Vector_impl_data._M_start; pTVar15 != pTVar16;
        pTVar15 = pTVar15 + 1) {
      poVar7 = std::operator<<((ostream *)&out,"W,,");
      lVar8 = (long)(pTVar15->vecEdges).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pTVar15->vecEdges).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      uVar9 = lVar8 >> 3;
      if (uVar9 < 4) {
        pcVar12 = (char *)((long)&DAT_00218284 + (long)(int)(&DAT_00218284)[uVar9]);
      }
      else {
        pcVar12 = "star,";
        if (lVar8 == 0x20) {
          pcVar12 = "diamond,";
        }
      }
      poVar7 = std::operator<<(poVar7,pcVar12);
      bVar5 = Apt::IsConnectedToRwy(this,sVar11);
      pcVar12 = "red,";
      if ((!bVar5) &&
         (pcVar12 = "aqua,",
         (long)(pTVar15->vecEdges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pTVar15->vecEdges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start == 0x10)) {
        pcVar12 = "blue,";
      }
      poVar7 = std::operator<<(poVar7,pcVar12);
      std::operator<<(poVar7,"0,");
      poVar7 = std::ostream::_M_insert<double>(pTVar15->lat);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>(pTVar15->lon);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,",,,");
      poVar7 = std::operator<<(poVar7,"Node ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7," edges");
      std::operator<<(poVar7,"\n");
      sVar11 = sVar11 + 1;
    }
    pTVar3 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar13 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start; pTVar13 != pTVar3;
        pTVar13 = pTVar13 + 1) {
      pTVar15 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl
                .super__Vector_impl_data._M_start;
      sVar11 = pTVar13->a;
      sVar4 = pTVar13->b;
      poVar7 = std::operator<<((ostream *)&out,"T,1,,");
      pcVar12 = "blue,";
      if (pTVar13->type == RUN_WAY) {
        pcVar12 = "red,";
      }
      poVar7 = std::operator<<(poVar7,pcVar12);
      lround(pTVar13->angle);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::operator<<(poVar7,',');
      pTVar16 = pTVar15 + sVar11;
      poVar7 = std::ostream::_M_insert<double>(pTVar16->lat);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>(pTVar16->lon);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,",,");
      lround(pTVar13->angle);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,"Edge ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,',');
      lround(pTVar13->angle);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,anon_var_dwarf_138773);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,'-');
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<((ostream *)&out,"T,0,,");
      pcVar12 = "blue,";
      if (pTVar13->type == RUN_WAY) {
        pcVar12 = "red,";
      }
      poVar7 = std::operator<<(poVar7,pcVar12);
      lround(pTVar13->angle);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::operator<<(poVar7,',');
      pTVar15 = pTVar15 + sVar4;
      poVar7 = std::ostream::_M_insert<double>(pTVar15->lat);
      std::operator<<(poVar7,',');
      poVar7 = std::ostream::_M_insert<double>(pTVar15->lon);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,",,");
      lround(pTVar13->angle);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      poVar7 = std::operator<<(poVar7,',');
      poVar7 = std::operator<<(poVar7,',');
      std::operator<<(poVar7,"\n");
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    std::__cxx11::string::~string((string *)&fileName);
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool LTAptDump (const std::string& _aptId)
{
    // find the airport by id
    if (gmapApt.count(_aptId) < 1) return false;
    try {
        const Apt& apt = gmapApt.at(_aptId);
        
        // open the output file
        const std::string fileName (dataRefs.GetXPSystemPath() + _aptId + ".csv");
        std::ofstream out (fileName, std::ios_base::out | std::ios_base::trunc);
        // column headers
        out << "type,BOT,symbol,color,rotation,latitude,longitude,time,speed,course,name,desc\n";
        out.precision(11);               // precision is all digits, so we need something like 123.45678901
        
        // Dump all rwy endpoints as Waypoints
        for (const RwyEndPt& re: apt.GetRwyEndPtVec())
            out
            << "W,,"                                    // type, BOT
            << "arrow,"                                 // symbol
            << "red,"                                   // color
            << std::lround(re.heading) << ','           // rotation
            << re.lat << ',' << re.lon << ','           // latitude,longitude
            << ",,,"                                    // time,speed,course
            << re.id << ','                             // name
            << std::lround(re.heading) << "°,"          // desc
            << "\n";
        
        // Dump all startup locations as Waypoints
        for (const StartupLoc& loc: apt.GetStartupLocVec())
            out
            << "W,,"                                    // type, BOT
            << "wedge,"                                 // symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.lat << ',' << loc.lon << ','         // latitude,longitude
            << ",,,"                                    // time,speed,course
            << loc.id << ','                            // name
            << std::lround(loc.heading) << "°,"         // desc
            << "\n";
        
        // Dump all startup paths as tracks
        for (const StartupLoc& loc: apt.GetStartupLocVec())
        {
            out
            << "T,1,,"                                  // type, BOT, symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.lat << ',' << loc.lon << ','         // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(loc.heading) << ','          // course
            << "Path leaving " << loc.id << ','         // name
            << std::lround(loc.heading) << "°,"         // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << "orange,"                                // color
            << std::lround(loc.heading) << ','          // rotation
            << loc.viaPos.y << ',' << loc.viaPos.x << ','  // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(loc.heading) << ','          // course
            << ','                                      // name, desc
            << "\n";

        }
        
        // Dump all nodes as Waypoints
        size_t i = 0;
        for (const TaxiNode& n: apt.GetTaxiNodesVec()) {
            out
            << "W,,"                                    // type, BOT
            << (n.vecEdges.size() == 0 ? "pin," :       // symbol
                n.vecEdges.size() == 1 ? "circle," :
                n.vecEdges.size() == 2 ? "square," :
                n.vecEdges.size() == 3 ? "triangle," :
                n.vecEdges.size() == 4 ? "diamond," : "star,")
            << (apt.IsConnectedToRwy(i) ? "red," :        // color: red if rwy, blue if 2 edges, else auqa
                n.vecEdges.size() == 2 ? "blue," : "aqua,")
            << "0,"                                     // rotation
            << n.lat << ',' << n.lon << ','             // latitude,longitude
            << ",,,"                                    // time,speed,course
            << "Node " << i << ','                      // name
            << n.vecEdges.size() << " edges"            // desc
            << "\n";
            i++;
        }
        
        // Dump all edges as Tracks
        i = 0;
        for (const TaxiEdge& e: apt.GetTaxiEdgeVec())
        {
            const TaxiNode& a = e.GetA(apt);
            const TaxiNode& b = e.GetB(apt);
            
            out
            << "T,1,,"                                  // type, BOT, symbol
            << (e.GetType() == TaxiEdge::RUN_WAY ? "red," : "blue,")  // color
            << std::lround(e.angle) << ','              // rotation
            << a.lat << ',' << a.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(e.angle) << ','              // course
            << "Edge " << (i++) << ','                  // name
            << std::lround(e.angle) << "°, nodes " << e.startNode() << '-' << e.endNode() // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << (e.GetType() == TaxiEdge::RUN_WAY ? "red," : "blue,")  // color
            << std::lround(e.angle) << ','              // rotation
            << b.lat << ',' << b.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << std::lround(e.angle) << ','              // course
            << ','                                      // name, desc
            << "\n";

        }
            
#ifdef DEBUG
        // Dump all Bezier handles
        for (auto iter = apt.vecBezierHandles.cbegin();
             iter != apt.vecBezierHandles.cend();
             ++iter)
        {
            const TaxiNode& a = *iter;
            const TaxiNode& b = *(++iter);
            
            out
            << "T,1,,"                                  // type, BOT, symbol
            << (a.bVisited ? "orange," : "magenta,")    // color (mirrored control point or not?)
            <<  ','                                     // rotation
            << a.lat << ',' << a.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << ','                                      // course
            << "Bezier Handle Ln " << a.prevIdx << ','  // name
            << (a.bVisited ? "mirrored" : "")           // desc
            << "\n";

            out
            << "T,0,,"                                  // type, BOT, symbol
            << (a.bVisited ? "orange," : "magenta,")    // color (mirrored control point or not?)
            <<  ','                                     // rotation
            << b.lat << ',' << b.lon << ','             // latitude,longitude
            << ",,"                                     // time,speed
            << ','                                      // course
            << ','                                      // name, desc
            << "\n";
        }
#endif
        
        // Close the file
        out.close();
        return true;
    }
    catch (...) {
        return false;
    }
}